

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_get_unique_default(char *unique_expr,lyd_node *list,char **dflt)

{
  uint uVar1;
  ly_ctx *ctx;
  lys_ext_instance **pplVar2;
  lys_node **pplVar3;
  lys_node *plVar4;
  long lVar5;
  lys_node *plVar6;
  int iVar7;
  lys_ext_instance ***ppplVar8;
  ly_set *set;
  ly_set *set_00;
  uint uVar9;
  lys_node *local_50;
  lyd_node *node;
  int_log_opts local_3c;
  lys_node *plStack_38;
  int_log_opts prev_ilo;
  uint uVar10;
  
  if ((unique_expr == (char *)0x0) || (dflt == (char **)0x0)) {
    __assert_fail("unique_expr && list && dflt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x1894,
                  "int lyd_get_unique_default(const char *, struct lyd_node *, const char **)");
  }
  ctx = list->schema->module->ctx;
  *dflt = (char *)0x0;
  iVar7 = resolve_descendant_schema_nodeid
                    (unique_expr,list->schema->child,4,1,&stack0xffffffffffffffc8);
  plVar6 = plStack_38;
  if (iVar7 == 0 && plStack_38 != (lys_node *)0x0) {
    if (plStack_38[1].prev == (lys_node *)0x0) {
      if ((plStack_38->flags & 0x40) == 0) {
        ppplVar8 = &plStack_38[1].ext;
        while (pplVar2 = *ppplVar8, pplVar2 != (lys_ext_instance **)0x0) {
          if (*dflt != (char *)0x0) goto LAB_00166e5c;
          *dflt = (char *)pplVar2[0xf];
          ppplVar8 = (lys_ext_instance ***)(pplVar2 + 9);
        }
      }
      if (*dflt == (char *)0x0) {
        return 0;
      }
    }
    else {
      *dflt = (char *)plStack_38[1].prev;
    }
LAB_00166e5c:
    node = (lyd_node *)ctx;
    set = ly_set_new();
    for (plStack_38 = lys_parent(plStack_38); plStack_38 != list->schema;
        plStack_38 = lys_parent(plStack_38)) {
      if ((plStack_38->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE|LYS_CONTAINER)) == LYS_UNKNOWN) {
        ly_log((ly_ctx *)node,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
               ,0x18b1);
        ly_set_free(set);
        goto LAB_00166fcb;
      }
      ly_set_add(set,plStack_38,1);
    }
    ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,&local_3c,(ly_err_item **)0x0);
    uVar9 = 0;
    while (uVar1 = set->number, uVar9 < uVar1) {
      pplVar3 = (set->set).s;
      plVar4 = pplVar3[uVar9];
      uVar10 = uVar9;
      if (plVar4->nodetype == LYS_CHOICE) {
        if ((lys_node *)list == (lys_node *)0x0) {
          list = (lyd_node *)0x0;
        }
        else {
          uVar10 = uVar9 + 1;
          plStack_38 = plVar6;
          if ((((uVar10 == uVar1) ||
               (plStack_38 = pplVar3[uVar10], plStack_38->nodetype != LYS_CASE)) ||
              (uVar1 <= uVar9 + 2)) || (pplVar3[uVar9 + 2]->nodetype != LYS_CHOICE)) {
            local_50 = ((lys_node *)list)->parent;
            iVar7 = lyv_multicases((lyd_node *)0x0,plStack_38,(lyd_node **)&local_50,0,
                                   (lyd_node *)0x0);
            uVar10 = uVar9;
            plVar4 = plStack_38;
            if (iVar7 != 0) goto LAB_00166fdc;
          }
        }
      }
      else if (plVar4->nodetype == LYS_CONTAINER) {
        plStack_38 = plVar4;
        if ((lys_node *)list == (lys_node *)0x0) {
          list = (lyd_node *)0x0;
LAB_00166f8d:
          lVar5._0_2_ = plStack_38[1].flags;
          lVar5._2_1_ = plStack_38[1].ext_size;
          lVar5._3_1_ = plStack_38[1].iffeature_size;
          lVar5._4_1_ = plStack_38[1].padding[0];
          lVar5._5_1_ = plStack_38[1].padding[1];
          lVar5._6_1_ = plStack_38[1].padding[2];
          lVar5._7_1_ = plStack_38[1].padding[3];
          plVar4 = plStack_38;
          if (lVar5 == 0) goto LAB_00166f97;
        }
        else {
          set_00 = lyd_find_path(list,plVar4->name);
          if ((set_00 != (ly_set *)0x0) && (set_00->number < 2)) {
            if (set_00->number == 0) {
              list = (lyd_node *)0x0;
            }
            else {
              list = (lyd_node *)*(set_00->set).s;
            }
            ly_set_free(set_00);
            goto LAB_00166f8d;
          }
          ly_set_free(set_00);
        }
LAB_00166fdc:
        *dflt = (char *)0x0;
        break;
      }
LAB_00166f97:
      plStack_38 = plVar4;
      uVar9 = uVar10 + 1;
    }
    iVar7 = 0;
    ly_ilo_restore((ly_ctx *)0x0,local_3c,(ly_err_item *)0x0,0);
    ly_set_free(set);
  }
  else {
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
           ,0x1899);
LAB_00166fcb:
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

int
lyd_get_unique_default(const char* unique_expr, struct lyd_node *list, const char **dflt)
{
    struct ly_ctx *ctx = list->schema->module->ctx;
    const struct lys_node *parent;
    const struct lys_node_leaf *sleaf = NULL;
    struct lys_tpdf *tpdf;
    struct lyd_node *last, *node;
    struct ly_set *s, *r;
    unsigned int i;
    enum int_log_opts prev_ilo;

    assert(unique_expr && list && dflt);
    *dflt = NULL;

    if (resolve_descendant_schema_nodeid(unique_expr, list->schema->child, LYS_LEAF, 1, &parent) || !parent) {
        /* error, but unique expression was checked when the schema was parsed so this should not happened */
        LOGINT(ctx);
        return -1;
    }

    sleaf = (struct lys_node_leaf *)parent;
    if (sleaf->dflt) {
        /* leaf has a default value */
        *dflt = sleaf->dflt;
    } else if (!(sleaf->flags & LYS_MAND_TRUE)) {
        /* get the default value from the type */
        for (tpdf = sleaf->type.der; tpdf && !(*dflt); tpdf = tpdf->type.der) {
            *dflt = tpdf->dflt;
        }
    }

    if (!(*dflt)) {
        return 0;
    }

    /* it has default value, but check if it can appear in the data tree under the list */
    s = ly_set_new();
    for (parent = lys_parent((struct lys_node *)sleaf); parent != list->schema; parent = lys_parent(parent)) {
        if (!(parent->nodetype & (LYS_CONTAINER | LYS_CASE | LYS_CHOICE | LYS_USES))) {
            /* This should be already detected when parsing schema */
            LOGINT(ctx);
            ly_set_free(s);
            return -1;
        }
        ly_set_add(s, (void *)parent, LY_SET_OPT_USEASLIST);
    }

    ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
    for (i = 0, last = list; i < s->number; i++) {
        parent = s->set.s[i]; /* shortcut */

        switch (parent->nodetype) {
        case LYS_CONTAINER:
            if (last) {
                /* find instance in the data */
                r = lyd_find_path(last, parent->name);
                if (!r || r->number > 1) {
                    ly_set_free(r);
                    *dflt = NULL;
                    goto end;
                }
                if (r->number) {
                    last = r->set.d[0];
                } else {
                    last = NULL;
                }
                ly_set_free(r);
            }
            if (((struct lys_node_container *)parent)->presence) {
                /* not-instantiated presence container on path */
                *dflt = NULL;
                goto end;
            }
            break;
        case LYS_CHOICE :
            /* check presence of another case */
            if (!last) {
                continue;
            }

            /* remember the case to be searched in choice by lyv_multicases() */
            if (i + 1 == s->number) {
                parent = (struct lys_node *)sleaf;
            } else if (s->set.s[i + 1]->nodetype == LYS_CASE && (i + 2 < s->number) &&
                    s->set.s[i + 2]->nodetype == LYS_CHOICE) {
                /* nested choices are covered by lyv_multicases, we just have to pass
                 * the lowest choice */
                i++;
                continue;
            } else {
                parent = s->set.s[i + 1];
            }
            node = last->child;
            if (lyv_multicases(NULL, (struct lys_node *)parent, &node, 0, NULL)) {
                /* another case is present */
                *dflt = NULL;
                goto end;
            }
            break;
        default:
            /* LYS_CASE, LYS_USES */
            continue;
        }
    }

end:
    ly_ilo_restore(NULL, prev_ilo, NULL, 0);
    ly_set_free(s);
    return 0;
}